

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O0

void __thiscall Clone_model_Test::~Clone_model_Test(Clone_model_Test *this)

{
  Clone_model_Test *this_local;
  
  ~Clone_model_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Clone, model)
{
    auto m = libcellml::Model::create();
    m->setId("unique_model");
    m->setName("model");
    m->setEncapsulationId("encapsulation_id");

    auto mClone = m->clone();

    compareModel(m, mClone);
}